

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O1

void __thiscall cfd::Psbt::Verify(Psbt *this,OutPoint *outpoint)

{
  char cVar1;
  uint32_t index;
  const_iterator cVar2;
  CfdException *this_00;
  ByteData *stack;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar3;
  ByteData scriptsig;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> witness_stack;
  Transaction tx;
  TxIn txin;
  UtxoData utxo;
  ByteData local_6e0;
  function<cfd::core::ByteData256_(const_cfd::core::Transaction_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*)>
  local_6c8;
  AbstractTxInReference local_6a0;
  undefined1 local_610 [32];
  Transaction local_5f0 [64];
  AbstractTxIn local_5b0;
  UtxoData local_520;
  
  cVar2 = std::
          _Rb_tree<cfd::core::OutPoint,_cfd::core::OutPoint,_std::_Identity<cfd::core::OutPoint>,_std::less<cfd::core::OutPoint>,_std::allocator<cfd::core::OutPoint>_>
          ::find(&(this->verify_ignore_map_)._M_t,outpoint);
  if ((_Rb_tree_header *)cVar2._M_node ==
      &(this->verify_ignore_map_)._M_t._M_impl.super__Rb_tree_header) {
    cfd::core::Psbt::GetTransaction();
    index = GetTxInIndex(this,outpoint);
    cVar1 = cfd::core::Psbt::IsFinalizedInput((uint)this);
    if (cVar1 == '\0') {
      local_520.block_height = 0x2673d3;
      local_520.block_hash._vptr_BlockHash._0_4_ = 0x251;
      local_520.block_hash.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = "Verify";
      core::logger::log<>((CfdSourceLocation *)&local_520,kCfdLogLevelWarning,
                          "psbt txin not finalized yet.");
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      local_520.block_height = (uint64_t)&local_520.block_hash.data_;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_520,"psbt txin not finalized yet.","");
      core::CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)&local_520);
      __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    GetUtxoData(&local_520,this,index,kMainnet);
    cfd::core::Transaction::GetTxIn((uint)&local_6a0);
    cfd::core::TxIn::TxIn((TxIn *)&local_5b0,&local_520.txid,local_520.vout,local_6a0.sequence_);
    core::AbstractTxInReference::~AbstractTxInReference(&local_6a0);
    cfd::core::Psbt::GetTxInFinalScript((uint)&local_6a0,SUB81(this,0));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_6e0.data_,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               local_6a0._vptr_AbstractTxInReference);
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
              ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&local_6a0);
    cVar1 = cfd::core::ByteData::IsEmpty();
    if (cVar1 == '\0') {
      cfd::core::Script::Script((Script *)&local_6a0,&local_6e0);
      cfd::core::AbstractTxIn::SetUnlockingScript((Script *)&local_5b0);
      core::Script::~Script((Script *)&local_6a0);
    }
    cfd::core::Psbt::GetTxInFinalScript((uint)&local_6a0,SUB81(this,0));
    if (local_6a0._vptr_AbstractTxInReference != local_6a0.txid_._vptr_Txid) {
      pvVar3 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               local_6a0._vptr_AbstractTxInReference;
      do {
        cfd::core::AbstractTxIn::AddScriptWitnessStack((ByteData *)local_610);
        local_610._0_8_ = &PTR__ScriptWitness_002b2f60;
        std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                  ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                   (local_610 + 8));
        pvVar3 = pvVar3 + 1;
      } while (pvVar3 != (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         local_6a0.txid_._vptr_Txid);
    }
    local_6c8.super__Function_base._M_functor._8_8_ = 0;
    local_6c8.super__Function_base._M_functor._M_unused._M_object = CollectSighashByTx;
    local_6c8._M_invoker =
         std::
         _Function_handler<cfd::core::ByteData256_(const_cfd::core::Transaction_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*),_cfd::core::ByteData256_(*)(const_cfd::core::Transaction_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*)>
         ::_M_invoke;
    local_6c8.super__Function_base._M_manager =
         std::
         _Function_handler<cfd::core::ByteData256_(const_cfd::core::Transaction_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*),_cfd::core::ByteData256_(*)(const_cfd::core::Transaction_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*)>
         ::_M_manager;
    TransactionContextUtil::Verify<cfd::core::Transaction>
              (local_5f0,outpoint,&local_520,&local_5b0,&local_6c8);
    if (local_6c8.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_6c8.super__Function_base._M_manager)
                ((_Any_data *)&local_6c8,(_Any_data *)&local_6c8,__destroy_functor);
    }
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
              ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&local_6a0);
    if (local_6e0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_6e0.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    core::AbstractTxIn::~AbstractTxIn(&local_5b0);
    UtxoData::~UtxoData(&local_520);
    core::Transaction::~Transaction(local_5f0);
  }
  return;
}

Assistant:

void Psbt::Verify(const OutPoint& outpoint) const {
  if (verify_ignore_map_.find(outpoint) == verify_ignore_map_.end()) {
    auto tx = GetTransaction();
    uint32_t index = GetTxInIndex(outpoint);
    if (!IsFinalizedInput(index)) {
      warn(CFD_LOG_SOURCE, "psbt txin not finalized yet.");
      throw CfdException(
          CfdError::kCfdIllegalStateError, "psbt txin not finalized yet.");
    }

    UtxoData utxo = GetUtxoData(index);
    TxIn txin(utxo.txid, utxo.vout, tx.GetTxIn(index).GetSequence());
    ByteData scriptsig = cfd::core::Psbt::GetTxInFinalScript(index, false)[0];
    if (!scriptsig.IsEmpty()) txin.SetUnlockingScript(Script(scriptsig));
    auto witness_stack = cfd::core::Psbt::GetTxInFinalScript(index, true);
    for (const auto& stack : witness_stack) {
      txin.AddScriptWitnessStack(stack);
    }

    TransactionContextUtil::Verify<Transaction>(
        &tx, outpoint, utxo, &txin, CollectSighashByTx);
  }
}